

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

int tc_uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,tc_uECC_Curve curve)

{
  cmpresult_t cVar1;
  tc_uECC_word_t tVar2;
  tc_uECC_word_t local_88 [2];
  tc_uECC_word_t _public [16];
  tc_uECC_word_t _private [8];
  tc_uECC_Curve curve_local;
  uint8_t *public_key_local;
  uint8_t *private_key_local;
  
  tc_uECC_vli_bytesToNative(_public + 0xe,private_key,(curve->num_n_bits + 7) / 8);
  tVar2 = tc_uECC_vli_isZero(_public + 0xe,(wordcount_t)((curve->num_n_bits + 0x1f) / 0x20));
  if (tVar2 == 0) {
    cVar1 = tc_uECC_vli_cmp(curve->n,_public + 0xe,(wordcount_t)((curve->num_n_bits + 0x1f) / 0x20))
    ;
    if (cVar1 == '\x01') {
      tVar2 = EccPoint_compute_public_key(local_88,_public + 0xe,curve);
      if (tVar2 == 0) {
        private_key_local._4_4_ = 0;
      }
      else {
        tc_uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,local_88);
        tc_uECC_vli_nativeToBytes
                  (public_key + (int)curve->num_bytes,(int)curve->num_bytes,
                   _public + (long)(int)curve->num_words + -2);
        private_key_local._4_4_ = 1;
      }
    }
    else {
      private_key_local._4_4_ = 0;
    }
  }
  else {
    private_key_local._4_4_ = 0;
  }
  return private_key_local._4_4_;
}

Assistant:

int tc_uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key,
			    tc_uECC_Curve curve)
{

	tc_uECC_word_t _private[NUM_ECC_WORDS];
	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(
	_private,
	private_key,
	BITS_TO_BYTES(curve->num_n_bits));

	/* Make sure the private key is in the range [1, n-1]. */
	if (tc_uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
		return 0;
	}

	if (tc_uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
		return 0;
	}

	/* Compute public key. */
	if (!EccPoint_compute_public_key(_public, _private, curve)) {
		return 0;
	}

	tc_uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
	tc_uECC_vli_nativeToBytes(
	public_key +
	curve->num_bytes, curve->num_bytes, _public + curve->num_words);
	return 1;
}